

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::Inserter::insertOne
          (Inserter *this,qsizetype pos,Output *t)

{
  Output *pOVar1;
  qsizetype i;
  long lVar2;
  long lVar3;
  
  setup(this,pos,1);
  pOVar1 = this->end;
  if (this->sourceCopyConstruct != 0) {
    QLinuxFbDevice::Output::Output(pOVar1,t);
    this->size = this->size + 1;
    return;
  }
  QLinuxFbDevice::Output::Output(pOVar1,pOVar1 + -1);
  this->size = this->size + 1;
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != this->move; lVar2 = lVar2 + -1) {
    pOVar1 = (Output *)((long)&(this->last->kmsOutput).name.d.d + lVar3);
    QLinuxFbDevice::Output::operator=(pOVar1,pOVar1 + -1);
    lVar3 = lVar3 + -0x170;
  }
  QLinuxFbDevice::Output::operator=(this->where,t);
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }